

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

ZoneHashEntry * __thiscall
AbbrHashEntry::search(AbbrHashEntry *this,int start_idx,ZoneSearchSpec *spec,ZoneHashEntry *zone)

{
  int i;
  long lVar1;
  char *pcVar2;
  
  lVar1 = (long)start_idx;
  pcVar2 = &this->entries[lVar1].dst;
  while( true ) {
    if (*(int *)&(this->super_CVmHashEntryCI).super_CVmHashEntry.field_0x24 <= lVar1) {
      return (ZoneHashEntry *)0x0;
    }
    if (((((AbbrToZone *)(pcVar2 + -0xc))->zone == zone) && (*(int *)(pcVar2 + -4) == spec->gmtofs))
       && (*pcVar2 == spec->dst)) break;
    lVar1 = lVar1 + 1;
    pcVar2 = pcVar2 + 0x10;
  }
  return ((AbbrToZone *)(pcVar2 + -0xc))->zone;
}

Assistant:

ZoneHashEntry *search(int start_idx, const ZoneSearchSpec *spec,
                          const ZoneHashEntry *zone)
    {
        for (int i = start_idx ; i < entry_cnt ; ++i)
        {
            if (entries[i].zone == zone
                && entries[i].gmtofs == spec->gmtofs
                && entries[i].dst == spec->dst)
                return entries[i].zone;
        }

        return 0;
    }